

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisAngularAccelerometerSensor.cpp
# Opt level: O1

ThreeAxisAngularAccelerometerSensor * __thiscall
iDynTree::ThreeAxisAngularAccelerometerSensor::operator=
          (ThreeAxisAngularAccelerometerSensor *this,ThreeAxisAngularAccelerometerSensor *other)

{
  ThreeAxisAngularAccelerometerPrivateAttributes *pTVar1;
  ThreeAxisAngularAccelerometerPrivateAttributes *pTVar2;
  
  if (this != other) {
    pTVar1 = other->pimpl;
    pTVar2 = this->pimpl;
    std::__cxx11::string::_M_assign((string *)pTVar2);
    iDynTree::Transform::operator=(&pTVar2->link_H_sensor,&pTVar1->link_H_sensor);
    pTVar2->parent_link_index = pTVar1->parent_link_index;
    std::__cxx11::string::_M_assign((string *)&pTVar2->parent_link_name);
  }
  return this;
}

Assistant:

ThreeAxisAngularAccelerometerSensor& ThreeAxisAngularAccelerometerSensor::operator=(const ThreeAxisAngularAccelerometerSensor& other)
{
    if(this != &other)
    {
        *pimpl = *(other.pimpl);
    }
    return *this;
}